

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisualElement.cpp
# Opt level: O3

shared_ptr<iDynTree::XMLElement> __thiscall
iDynTree::VisualElement::childElementForName(VisualElement *this,string *name)

{
  int iVar1;
  XMLParserState *pXVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<iDynTree::XMLElement> sVar4;
  undefined1 local_39;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  void *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  iVar1 = std::__cxx11::string::compare((char *)in_RDX);
  if (iVar1 == 0) {
    pXVar2 = (XMLParserState *)iDynTree::XMLElement::getParserState();
    local_38 = (GeometryElement *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<iDynTree::OriginElement,std::allocator<iDynTree::OriginElement>,iDynTree::XMLParserState&,iDynTree::Transform&>
              (&_Stack_30,(OriginElement **)&local_38,
               (allocator<iDynTree::OriginElement> *)&local_28,pXVar2,
               (Transform *)(name[1].field_2._M_local_buf + 8));
    _Var3._M_pi = extraout_RDX_00;
LAB_00134d3f:
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)in_RDX);
    if (iVar1 == 0) {
      pXVar2 = (XMLParserState *)iDynTree::XMLElement::getParserState();
      local_38 = (GeometryElement *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<iDynTree::GeometryElement,std::allocator<iDynTree::GeometryElement>,iDynTree::XMLParserState&,std::shared_ptr<iDynTree::SolidShape>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                (&_Stack_30,(GeometryElement **)&local_38,
                 (allocator<iDynTree::GeometryElement> *)&local_28,pXVar2,
                 (shared_ptr<iDynTree::SolidShape> *)((long)&name[4].field_2 + 8),
                 *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   **)((long)&name[5].field_2 + 8));
      _Var3._M_pi = extraout_RDX_01;
      goto LAB_00134d3f;
    }
    iVar1 = std::__cxx11::string::compare((char *)in_RDX);
    if (iVar1 != 0) {
      pXVar2 = (XMLParserState *)iDynTree::XMLElement::getParserState();
      *(undefined8 *)this = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<iDynTree::XMLElement,std::allocator<iDynTree::XMLElement>,iDynTree::XMLParserState&,std::__cxx11::string_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->field_0x8,(XMLElement **)this,
                 (allocator<iDynTree::XMLElement> *)&local_38,pXVar2,in_RDX);
      _Var3._M_pi = extraout_RDX;
      goto LAB_00134d46;
    }
    pXVar2 = (XMLParserState *)iDynTree::XMLElement::getParserState();
    local_28 = (void *)0x0;
    local_38 = (GeometryElement *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<iDynTree::MaterialElement,std::allocator<iDynTree::MaterialElement>,iDynTree::XMLParserState&,decltype(nullptr)>
              (&_Stack_30,(MaterialElement **)&local_38,
               (allocator<iDynTree::MaterialElement> *)&local_39,pXVar2,&local_28);
    MaterialElement::materialInfo((MaterialElement *)local_38);
    name[5]._M_string_length = (size_type)local_28;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&name[5].field_2._M_allocated_capacity,
               &local_20);
    _Var3._M_pi = extraout_RDX_02;
    if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
      _Var3._M_pi = extraout_RDX_03;
    }
  }
  *(undefined4 *)this = (undefined4)local_38;
  *(undefined4 *)&this->field_0x4 = local_38._4_4_;
  *(undefined4 *)&this->field_0x8 = _Stack_30._M_pi._0_4_;
  *(undefined4 *)&this->field_0xc = _Stack_30._M_pi._4_4_;
LAB_00134d46:
  sVar4.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_XMLElement;
  return (shared_ptr<iDynTree::XMLElement>)
         sVar4.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<iDynTree::XMLElement> VisualElement::childElementForName(const std::string& name) {
        if (name == "origin") {
            return std::make_shared<OriginElement>(getParserState(), m_info.m_origin);
        } else if (name == "geometry") {
            return std::make_shared<GeometryElement>(
                getParserState(), m_info.m_solidShape, m_info.m_packageDirs);
        } else if (name == "material") {
            auto ptr = std::make_shared<MaterialElement>(getParserState(), nullptr);
            m_info.m_material = ptr->materialInfo();
            return ptr;
        }
        return std::make_shared<XMLElement>(getParserState(), name);
    }